

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_table.c
# Opt level: O0

int32 hash_table_lookup_int32(hash_table_t *h,char *key,int32 *val)

{
  undefined4 uStack_30;
  int32 rv;
  void *vval;
  int32 *val_local;
  char *key_local;
  hash_table_t *h_local;
  
  vval = val;
  val_local = (int32 *)key;
  key_local = (char *)h;
  h_local._4_4_ = hash_table_lookup(h,key,(void **)&uStack_30);
  if (h_local._4_4_ == 0) {
    if (vval != (void *)0x0) {
      *(undefined4 *)vval = uStack_30;
    }
    h_local._4_4_ = 0;
  }
  return h_local._4_4_;
}

Assistant:

int32
hash_table_lookup_int32(hash_table_t * h, const char *key, int32 *val)
{
    void *vval;
    int32 rv;

    rv = hash_table_lookup(h, key, &vval);
    if (rv != 0)
        return rv;
    if (val)
        *val = (int32)(long)vval;
    return 0;
}